

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::build_sampled_image(Impl *this,Id image_id,Id sampler_id,bool comparison)

{
  bool bVar1;
  bool ms;
  Id IVar2;
  Dim dim;
  mapped_type *pmVar3;
  Builder *this_00;
  Operation *this_01;
  undefined7 in_register_00000009;
  long lVar4;
  CombinedImageSampler *pCVar5;
  long lVar6;
  __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
  _Var7;
  Id *pIVar8;
  __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
  __it;
  bool is_non_uniform;
  Id sampler_id_local;
  CombinedImageSampler *local_68;
  Id image_id_local;
  undefined4 local_5c;
  Vector<CombinedImageSampler> *local_58;
  undefined1 local_50 [16];
  bool *local_40;
  Id local_38;
  Id local_34;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,comparison);
  sampler_id_local = sampler_id;
  image_id_local = image_id;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->handle_to_resource_meta,&image_id_local);
  is_non_uniform = true;
  if (pmVar3->non_uniform == false) {
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->handle_to_resource_meta,&sampler_id_local);
    is_non_uniform = pmVar3->non_uniform;
  }
  local_40 = &is_non_uniform;
  local_58 = &this->combined_image_sampler_cache;
  __it._M_current =
       (this->combined_image_sampler_cache).
       super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->combined_image_sampler_cache).
             super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_50._8_8_ = &sampler_id_local;
  lVar4 = (long)local_68 - (long)__it._M_current;
  local_50._0_8_ = &image_id_local;
  for (lVar6 = lVar4 >> 6; _Var7._M_current = __it._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                          *)local_50,__it);
    pCVar5 = local_68;
    if (bVar1) goto LAB_0011843d;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                          *)local_50,__it._M_current + 1);
    pCVar5 = local_68;
    _Var7._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0011843d;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                          *)local_50,__it._M_current + 2);
    pCVar5 = local_68;
    _Var7._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0011843d;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                          *)local_50,__it._M_current + 3);
    pCVar5 = local_68;
    _Var7._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0011843d;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  pCVar5 = local_68;
  if (lVar4 == 1) {
LAB_00118598:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                          *)local_50,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar1) {
      _Var7._M_current = pCVar5;
    }
LAB_0011843d:
    if (_Var7._M_current != pCVar5) {
      pIVar8 = &(_Var7._M_current)->combined_id;
      goto LAB_00118560;
    }
  }
  else {
    if (lVar4 == 2) {
LAB_0011857e:
      pCVar5 = local_68;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                            *)local_50,__it);
      _Var7._M_current = __it._M_current;
      if (!bVar1) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00118598;
      }
      goto LAB_0011843d;
    }
    if (lVar4 == 3) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:5053:26)>
                            *)local_50,__it);
      pCVar5 = local_68;
      if (!bVar1) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0011857e;
      }
      goto LAB_0011843d;
    }
  }
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  IVar2 = get_type_id(this,image_id_local);
  dim = spv::Builder::getTypeDimensionality(this_00,IVar2);
  bVar1 = spv::Builder::isArrayedImageType(this_00,IVar2);
  ms = spv::Builder::isMultisampledImageType(this_00,IVar2);
  IVar2 = spv::Builder::getImageComponentType(this_00,IVar2);
  IVar2 = spv::Builder::makeImageType
                    (this_00,IVar2,dim,local_5c._0_1_,bVar1,ms,1,ImageFormatUnknown);
  IVar2 = spv::Builder::makeSampledImageType(this_00,IVar2);
  this_01 = allocate(this,OpSampledImage,IVar2);
  local_50._0_8_ = &local_38;
  local_38 = image_id_local;
  local_34 = sampler_id_local;
  local_50._8_8_ = (Id *)0x2;
  Operation::add_ids(this_01,(initializer_list<unsigned_int> *)local_50);
  add(this,this_01,false);
  if (is_non_uniform == true) {
    spv::Builder::addDecoration(this_00,this_01->id,DecorationNonUniform,-1);
    this_01->flags = this_01->flags | 1;
  }
  local_50._4_4_ = sampler_id_local;
  local_50._0_4_ = image_id_local;
  pIVar8 = &this_01->id;
  local_50[0xc] = is_non_uniform;
  local_50._8_4_ = this_01->id;
  std::
  vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
  ::emplace_back<dxil_spv::Converter::Impl::CombinedImageSampler>
            (local_58,(CombinedImageSampler *)local_50);
LAB_00118560:
  return *pIVar8;
}

Assistant:

spv::Id Converter::Impl::build_sampled_image(spv::Id image_id, spv::Id sampler_id, bool comparison)
{
	bool is_non_uniform =
	    handle_to_resource_meta[image_id].non_uniform || handle_to_resource_meta[sampler_id].non_uniform;

	auto itr = std::find_if(combined_image_sampler_cache.begin(), combined_image_sampler_cache.end(),
	                        [&](const CombinedImageSampler &combined) {
		                        return combined.image_id == image_id && combined.sampler_id == sampler_id &&
		                               combined.non_uniform == is_non_uniform;
	                        });

	if (itr != combined_image_sampler_cache.end())
		return itr->combined_id;

	auto &builder = spirv_module.get_builder();
	spv::Id image_type_id = get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool arrayed = builder.isArrayedImageType(image_type_id);
	bool multisampled = builder.isMultisampledImageType(image_type_id);
	spv::Id sampled_format = builder.getImageComponentType(image_type_id);

	image_type_id =
	    builder.makeImageType(sampled_format, dim, comparison, arrayed, multisampled, 1, spv::ImageFormatUnknown);

	Operation *op = allocate(spv::OpSampledImage, builder.makeSampledImageType(image_type_id));
	op->add_ids({ image_id, sampler_id });
	add(op);

	if (is_non_uniform)
	{
		builder.addDecoration(op->id, spv::DecorationNonUniformEXT);
		op->flags |= Operation::SinkableBit;
	}

	combined_image_sampler_cache.push_back({ image_id, sampler_id, op->id, is_non_uniform });
	return op->id;
}